

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * gravity_parser_run(gravity_parser_t *parser,gravity_delegate_t *delegate)

{
  gtoken_s token;
  uint32_t uVar1;
  char *source;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  char *local_28;
  gravity_delegate_t *local_20;
  gravity_delegate_t *delegate_local;
  gravity_parser_t *parser_local;
  
  parser->delegate = delegate;
  local_20 = delegate;
  delegate_local = (gravity_delegate_t *)parser;
  gravity_lexer_setdelegate(parser->lexer->p[parser->lexer->n - 1],delegate);
  if ((local_20 != (gravity_delegate_t *)0x0) &&
     (local_20->precode_callback != (gravity_precode_callback)0x0)) {
    source = (*local_20->precode_callback)(local_20->xdata);
    parser_appendcode(source,(gravity_parser_t *)delegate_local);
  }
  uVar1 = parser_run((gravity_parser_t *)delegate_local);
  if (uVar1 == 0) {
    if (**(long **)&delegate_local->report_null_errors == 0) {
      memset(&local_48,0,0x28);
      token.colno = (undefined4)uStack_40;
      token.position = uStack_40._4_4_;
      token.type = (undefined4)local_48;
      token.lineno = local_48._4_4_;
      token.bytes = (undefined4)local_38;
      token.length = local_38._4_4_;
      token.fileid = (undefined4)uStack_30;
      token.builtin = uStack_30._4_4_;
      token.value = local_28;
      parser_local = (gravity_parser_t *)
                     gnode_block_stat_create
                               (NODE_LIST_STAT,token,(gnode_r *)delegate_local->log_callback,
                                (gnode_t *)0x0,0);
    }
    else {
      parser_local = (gravity_parser_t *)0x0;
    }
  }
  else {
    parser_cleanup((gravity_parser_t *)delegate_local);
    parser_local = (gravity_parser_t *)0x0;
  }
  return (gnode_t *)parser_local;
}

Assistant:

gnode_t *gravity_parser_run (gravity_parser_t *parser, gravity_delegate_t *delegate) {
    parser->delegate = delegate;
    gravity_lexer_setdelegate(CURRENT_LEXER, delegate);

    // check if some user code needs to be prepended
    if ((delegate) && (delegate->precode_callback))
        parser_appendcode(delegate->precode_callback(delegate->xdata), parser);

    // if there are syntax errors then just returns
    if (parser_run(parser) > 0) {
        parser_cleanup (parser);
        return NULL;
    }

    // if there are some open declarations then there should be an error somewhere
    if (marray_size(*parser->declarations) > 0) return NULL;

    // return ast
    return gnode_block_stat_create(NODE_LIST_STAT, NO_TOKEN, parser->statements, NULL, 0);
}